

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::promptWrite(Private *this,usize offset,String *clearStr)

{
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  usize uVar6;
  usize uVar7;
  usize uVar8;
  char *pcVar9;
  uint *puVar10;
  usize uVar11;
  usize uVar12;
  String local_f8;
  String local_d0;
  undefined1 local_a8 [8];
  String dataToWrite;
  usize local_78;
  usize lineEnd;
  usize len;
  usize i;
  Array<unsigned_int> wrappedBuffer;
  undefined1 local_38 [8];
  Array<unsigned_int> buffer;
  String *clearStr_local;
  usize offset_local;
  Private *this_local;
  
  lVar1 = offset + (offset / this->stdoutScreenWidth) * 2;
  buffer._capacity = (usize)clearStr;
  uVar6 = Array<unsigned_int>::size(&this->prompt);
  uVar7 = Array<unsigned_int>::size(&this->input);
  uVar8 = String::length((String *)buffer._capacity);
  Array<unsigned_int>::Array((Array<unsigned_int> *)local_38,uVar6 + uVar7 + uVar8);
  Array<unsigned_int>::append((Array<unsigned_int> *)local_38,&this->prompt);
  Array<unsigned_int>::append((Array<unsigned_int> *)local_38,&this->input);
  bVar4 = String::isEmpty((String *)buffer._capacity);
  if (!bVar4) {
    uVar6 = String::length((String *)buffer._capacity);
    if (uVar6 != 1) {
      iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                            ,0x19c,"clearStr.isEmpty() || clearStr.length() == 1");
      if (iVar5 != 0) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
    }
  }
  bVar4 = String::isEmpty((String *)buffer._capacity);
  if (!bVar4) {
    pcVar9 = String::operator_cast_to_char_((String *)buffer._capacity);
    wrappedBuffer._capacity._0_4_ = (int)*pcVar9;
    Array<unsigned_int>::append((Array<unsigned_int> *)local_38,(uint *)&wrappedBuffer._capacity);
  }
  uVar6 = Array<unsigned_int>::size((Array<unsigned_int> *)local_38);
  uVar7 = Array<unsigned_int>::size((Array<unsigned_int> *)local_38);
  Array<unsigned_int>::Array
            ((Array<unsigned_int> *)&i,uVar6 + 2 + (uVar7 / this->stdoutScreenWidth) * 2);
  len = 0;
  uVar6 = Array<unsigned_int>::size((Array<unsigned_int> *)local_38);
  for (; len < uVar6; len = this->stdoutScreenWidth + len) {
    local_78 = uVar6 - len;
    if (this->stdoutScreenWidth < local_78) {
      local_78 = this->stdoutScreenWidth;
    }
    puVar10 = Array::operator_cast_to_unsigned_int_((Array *)local_38);
    Array<unsigned_int>::append((Array<unsigned_int> *)&i,puVar10 + len,local_78);
    if (local_78 == this->stdoutScreenWidth) {
      dataToWrite._data.ref._4_4_ = 0xd;
      Array<unsigned_int>::append
                ((Array<unsigned_int> *)&i,(uint *)((long)&dataToWrite._data.ref + 4));
      dataToWrite._data.ref._0_4_ = 10;
      Array<unsigned_int>::append((Array<unsigned_int> *)&i,(uint *)&dataToWrite._data.ref);
    }
  }
  uVar6 = Array<unsigned_int>::size((Array<unsigned_int> *)&i);
  String::String((String *)local_a8,(uVar6 - lVar1) * 4 + 10);
  String::String<6ul>(&local_d0,(char (*) [6])"\x1b[?7l");
  String::append((String *)local_a8,&local_d0);
  String::~String(&local_d0);
  puVar10 = Array::operator_cast_to_unsigned_int_((Array *)&i);
  uVar6 = Array<unsigned_int>::size((Array<unsigned_int> *)&i);
  bVar4 = Unicode::append(puVar10 + lVar1,uVar6 - lVar1,(String *)local_a8);
  if (!bVar4) {
    iVar5 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x1b1,
                          "Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite)"
                         );
    if (iVar5 != 0) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  String::String<6ul>(&local_f8,(char (*) [6])"\x1b[?7h");
  String::append((String *)local_a8,&local_f8);
  String::~String(&local_f8);
  pcVar9 = String::operator_cast_to_char_((String *)local_a8);
  uVar6 = String::length((String *)local_a8);
  writeConsole(this,pcVar9,uVar6);
  uVar2 = this->caretPos;
  uVar6 = Array<unsigned_int>::size(&this->input);
  uVar7 = String::length((String *)buffer._capacity);
  if (uVar2 < uVar6 + uVar7) {
    uVar6 = Array<unsigned_int>::size(&this->prompt);
    uVar7 = Array<unsigned_int>::size(&this->input);
    uVar8 = String::length((String *)buffer._capacity);
    uVar11 = Array<unsigned_int>::size(&this->input);
    uVar12 = String::length((String *)buffer._capacity);
    moveCursorPosition(this,uVar6 + uVar7 + uVar8,this->caretPos - (uVar11 + uVar12));
  }
  String::~String((String *)local_a8);
  Array<unsigned_int>::~Array((Array<unsigned_int> *)&i);
  Array<unsigned_int>::~Array((Array<unsigned_int> *)local_38);
  return;
}

Assistant:

void promptWrite(usize offset = 0, const String& clearStr = String())
  {
    offset += offset / stdoutScreenWidth * 2;
    Array<conchar> buffer(prompt.size() + input.size() + clearStr.length());
    buffer.append(prompt);
    buffer.append(input);
    ASSERT(clearStr.isEmpty() || clearStr.length() == 1);
    if(!clearStr.isEmpty())
      buffer.append(*(const char*)clearStr);
    Array<conchar> wrappedBuffer(buffer.size() + buffer.size() / stdoutScreenWidth * 2 + 2);
    for(usize i = 0, len = buffer.size(); i < len; i += stdoutScreenWidth)
    {
      usize lineEnd = len - i;
      if(lineEnd > stdoutScreenWidth)
        lineEnd = stdoutScreenWidth;
      wrappedBuffer.append((const conchar*)buffer + i, lineEnd);
      if(lineEnd == stdoutScreenWidth)
      {
        wrappedBuffer.append('\r');
        wrappedBuffer.append('\n');
      }
    }
#ifdef _MSC_VER
    writeConsole((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset);
#else
    String dataToWrite((wrappedBuffer.size() - offset) * sizeof(uint32) + 10);
    dataToWrite.append("\x1b[?7l");
    VERIFY(Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite));
    dataToWrite.append("\x1b[?7h");
    writeConsole(dataToWrite, dataToWrite.length());
#endif
    if(caretPos < input.size() + clearStr.length())
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), -(ssize)(input.size() + clearStr.length() - caretPos));
#ifdef _MSC_VER
    else // enforce cursor blink timer reset
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), 0);
#endif
  }